

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
notch::io::PlainTextNetworkReader::read_value<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,PlainTextNetworkReader *this,istream *in,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  istream *piVar1;
  
  piVar1 = std::ws<char,std::char_traits<char>>(in);
  piVar1 = std::operator>>(piVar1,(string *)value);
  std::ws<char,std::char_traits<char>>(piVar1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  return __return_storage_ptr__;
}

Assistant:

T
    read_value(std::istream &in, T &value) {
       in >> std::ws >> value >> std::ws;
       return value;
    }